

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O1

void __thiscall bgui::BaseWindow::setInfoText(BaseWindow *this,char *text)

{
  BaseWindowData *pBVar1;
  char *pcVar2;
  
  if ((*text == '\0') && ((this->p->text)._M_string_length == 0)) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
  pBVar1 = this->p;
  XPutImage(pBVar1->display,pBVar1->window,pBVar1->gc,pBVar1->image,0,0,0,0,pBVar1->w,pBVar1->h);
  pBVar1 = this->p;
  pcVar2 = (char *)(pBVar1->text)._M_string_length;
  strlen(text);
  std::__cxx11::string::_M_replace((ulong)&pBVar1->text,0,pcVar2,(ulong)text);
  anon_unknown_0::drawInfoText(this->p);
  pthread_mutex_unlock((pthread_mutex_t *)&this->p->mutex);
  return;
}

Assistant:

void BaseWindow::setInfoText(const char *text)
{
  if (strlen(text) == 0 && p->text.size() == 0)
  {
    return;
  }

  pthread_mutex_lock(&(p->mutex));

  // clear completely

  XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h);

  // store text

  p->text=text;

  // draw text

  drawInfoText(p);

  pthread_mutex_unlock(&(p->mutex));
}